

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZX8081.cpp
# Opt level: O1

void __thiscall
Sinclair::ZX8081::ConcreteMachine<false>::ConcreteMachine
          (ConcreteMachine<false> *this,Target *target,ROMFetcher *rom_fetcher)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  MemoryModel MVar1;
  uint8_t *buffer;
  _Base_ptr p_Var2;
  bool bVar3;
  uint16_t uVar4;
  _Base_ptr p_Var5;
  undefined4 *puVar6;
  uint16_t uVar7;
  Name name;
  _Rb_tree_header *p_Var8;
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  roms;
  Request request;
  _Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  local_88;
  Request local_58;
  
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_00593df0;
  (this->super_TimedMachine).clock_rate_ = 1.0;
  (this->super_TimedMachine).clock_conversion_error_ = 0.0;
  (this->super_TimedMachine).speed_multiplier_ = 1.0;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR___cxa_pure_virtual_00598440;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&PTR___cxa_pure_virtual_005983e0;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&PTR___cxa_pure_virtual_00598410;
  p_Var8 = &local_88._M_impl.super__Rb_tree_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl._0_8_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var8->_M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var8->_M_header;
  MachineTypes::MappedKeyboardMachine::MappedKeyboardMachine
            (&this->super_MappedKeyboardMachine,
             (set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
              *)&local_88);
  std::
  _Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~_Rb_tree(&local_88);
  (this->super_Device)._vptr_Device = (_func_int **)&PTR___cxa_pure_virtual_00598da0;
  local_88._M_impl._0_8_ = local_88._M_impl._0_8_ & 0xffffffff00000000;
  Utility::TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper>::
  TypeRecipient<Sinclair::ZX::Keyboard::Machine>
            (&this->super_TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper>,
             (Machine *)&local_88);
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_005a6fa8;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_005a7078;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_005a70b0;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_005a70c8;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_005a70e0;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_005a7110;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_005a7150;
  (this->super_TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper>).super_Delegate.
  super_KeyActions._vptr_KeyActions = (_func_int **)&PTR_set_key_state_005a7170;
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_005a71b0;
  CPU::Z80::Processor<Sinclair::ZX8081::ConcreteMachine<false>,_false,_false>::Processor
            (&this->z80_,this);
  ZX8081::Video::Video(&this->video_);
  this->should_autorun_ = false;
  this_00 = &this->ram_;
  (this->ram_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ram_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ram_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->vsync_ = false;
  this->hsync_ = false;
  this->line_counter_ = 0;
  ZX::Keyboard::Keyboard::Keyboard(&this->keyboard_,ZX80);
  ZX::Keyboard::KeyboardMapper::KeyboardMapper(&this->keyboard_mapper_,ZX80);
  Storage::Tape::BinaryTapePlayer::BinaryTapePlayer
            (&(this->tape_player_).super_BinaryTapePlayer,0x319750);
  (this->tape_player_).super_BinaryTapePlayer.super_TapePlayer.super_TimedEventLoop.
  _vptr_TimedEventLoop = (_func_int **)&PTR_process_next_event_005a6e18;
  (this->tape_player_).super_BinaryTapePlayer.super_TapePlayer.super_Source._vptr_Source =
       (_func_int **)&DAT_005a6e58;
  (this->tape_player_).half_cycles_.super_WrappedInt<HalfCycles>.length_ = 0;
  Storage::Tape::ZX8081::Parser::Parser(&this->parser_);
  this->nmi_is_enabled_ = false;
  (this->horizontal_counter_).super_WrappedInt<HalfCycles>.length_ = 0;
  this->latched_video_byte_ = '\0';
  this->has_latched_video_byte_ = false;
  this->use_fast_tape_hack_ = false;
  this->allow_fast_tape_hack_ = false;
  this->use_automatic_tape_motor_control_ = true;
  (this->tape_advance_delay_).super_WrappedInt<HalfCycles>.length_ = 0;
  Concurrency::AsyncTaskQueue<false,_true,_void>::AsyncTaskQueue<>(&this->audio_queue_);
  GI::AY38910::AY38910SampleSource<false>::AY38910SampleSource
            (&(this->ay_).super_AY38910SampleSource<false>,AY38910,&this->audio_queue_);
  (this->ay_).super_SampleSource<GI::AY38910::AY38910<false>,_false,_4>.master_divider_ = 0;
  Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>::PullLowpass
            (&this->speaker_,&this->ay_);
  (this->time_since_ay_update_).super_WrappedInt<HalfCycles>.length_ = 0;
  (this->super_TimedMachine).clock_rate_ = 3250000.0;
  Outputs::Speaker::LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>
  ::set_input_rate(&(this->speaker_).
                    super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>
                   ,1.625e+06);
  name = (byte)(target->ZX80_uses_ZX81_ROM | target->is_ZX81) & AcornBASICII | ZX80;
  ROM::Request::Request(&local_58,name,false);
  if ((rom_fetcher->super__Function_base)._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  (*rom_fetcher->_M_invoker)
            ((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)&local_88,(_Any_data *)rom_fetcher,&local_58);
  bVar3 = ROM::Request::validate(&local_58,(Map *)&local_88);
  p_Var5 = &p_Var8->_M_header;
  p_Var2 = local_88._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (!bVar3) {
    puVar6 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar6 = 0;
    __cxa_throw(puVar6,&ROMMachine::Error::typeinfo,0);
  }
  for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
      p_Var2 = (&p_Var2->_M_left)[(int)*(size_t *)(p_Var2 + 1) < (int)name]) {
    if ((int)name <= (int)*(size_t *)(p_Var2 + 1)) {
      p_Var5 = p_Var2;
    }
  }
  if (((_Rb_tree_header *)p_Var5 != p_Var8) &&
     ((int)((_Rb_tree_header *)p_Var5)->_M_node_count <= (int)name)) {
    p_Var8 = (_Rb_tree_header *)p_Var5;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(&this->rom_,p_Var8 + 1)
  ;
  this->rom_mask_ =
       ~(ushort)*(undefined4 *)
                 &(this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start +
       (short)*(undefined4 *)
               &(this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  MVar1 = target->memory_model;
  if (MVar1 == SixtyFourKB) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,0x10000);
    uVar4 = 0xffff;
    uVar7 = 0x2000;
  }
  else {
    if (MVar1 == SixteenKB) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,0x4000);
      uVar4 = 0x3fff;
    }
    else {
      if (MVar1 != Unexpanded) goto LAB_0039ddb6;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,0x400);
      uVar4 = 0x3ff;
    }
    uVar7 = 0x4000;
  }
  this->ram_base_ = uVar7;
  this->ram_mask_ = uVar4;
LAB_0039ddb6:
  buffer = (this->ram_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  Memory::Fuzz(buffer,(long)(this->ram_).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)buffer);
  ZX::Keyboard::Keyboard::clear_all_keys(&this->keyboard_);
  if ((target->loading_command)._M_string_length != 0) {
    Utility::TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper>::add_typer
              (&this->super_TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper>,
               &target->loading_command);
    this->should_autorun_ = true;
  }
  insert_media(this,&(target->super_Target).media);
  std::
  _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               *)&local_88);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            (&local_58.node.children);
  return;
}

Assistant:

ConcreteMachine(const Analyser::Static::ZX8081::Target &target, const ROMMachine::ROMFetcher &rom_fetcher) :
			Utility::TypeRecipient<CharacterMapper>(keyboard_machine()),
			z80_(*this),
			keyboard_(keyboard_machine()),
			keyboard_mapper_(keyboard_machine()),
			tape_player_(ZX8081ClockRate),
			ay_(GI::AY38910::Personality::AY38910, audio_queue_),
			speaker_(ay_) {
			set_clock_rate(ZX8081ClockRate);
			speaker_.set_input_rate(float(ZX8081ClockRate) / 2.0f);

			const bool use_zx81_rom = target.is_ZX81 || target.ZX80_uses_ZX81_ROM;
			const ROM::Name rom_name = use_zx81_rom ? ROM::Name::ZX81 : ROM::Name::ZX80;
			const ROM::Request request(rom_name);
			auto roms = rom_fetcher(request);
			if(!request.validate(roms)) {
				throw ROMMachine::Error::MissingROMs;
			}
			rom_ = std::move(roms.find(rom_name)->second);

			rom_mask_ = uint16_t(rom_.size() - 1);

			switch(target.memory_model) {
				case Analyser::Static::ZX8081::Target::MemoryModel::Unexpanded:
					ram_.resize(1024);
					ram_base_ = 16384;
					ram_mask_ = 1023;
				break;
				case Analyser::Static::ZX8081::Target::MemoryModel::SixteenKB:
					ram_.resize(16384);
					ram_base_ = 16384;
					ram_mask_ = 16383;
				break;
				case Analyser::Static::ZX8081::Target::MemoryModel::SixtyFourKB:
					ram_.resize(65536);
					ram_base_ = 8192;
					ram_mask_ = 65535;
				break;
			}
			Memory::Fuzz(ram_);

			// Ensure valid initial key state.
			clear_all_keys();
			if(!target.loading_command.empty()) {
				type_string(target.loading_command);
				should_autorun_ = true;
			}

			insert_media(target.media);
		}